

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

double duckdb::NoInfiniteNoZeroDoubleWrapper<duckdb::CotOperator>::Operation<double,double>
                 (double input)

{
  undefined8 uVar1;
  bool bVar2;
  double in_XMM0_Qa;
  allocator local_69;
  string local_68 [8];
  double in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffa8;
  OutOfRangeException *in_stack_ffffffffffffffb0;
  allocator local_31;
  string local_30 [32];
  double local_10;
  double local_8;
  
  local_10 = in_XMM0_Qa;
  bVar2 = duckdb::Value::IsFinite<double>(in_XMM0_Qa);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    bVar2 = true;
    if ((local_10 != 0.0) || (NAN(local_10))) {
      bVar2 = local_10 == -0.0;
    }
    if (bVar2) {
      uVar1 = __cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_68,"input value %lf is out of range for numeric function cotangent",&local_69
                );
      OutOfRangeException::OutOfRangeException<double>
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
      __cxa_throw(uVar1,&OutOfRangeException::typeinfo,OutOfRangeException::~OutOfRangeException);
    }
    local_8 = CotOperator::Operation<double,double>(7.32611804350126e-317);
  }
  else {
    bVar2 = duckdb::Value::IsNan<double>(local_10);
    if (!bVar2) {
      uVar1 = __cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_30,"input value %lf is out of range for numeric function",&local_31);
      OutOfRangeException::OutOfRangeException<double>
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
      __cxa_throw(uVar1,&OutOfRangeException::typeinfo,OutOfRangeException::~OutOfRangeException);
    }
    local_8 = local_10;
  }
  return local_8;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input) {
		if (DUCKDB_UNLIKELY(!Value::IsFinite(input))) {
			if (Value::IsNan(input)) {
				return input;
			}
			throw OutOfRangeException("input value %lf is out of range for numeric function", input);
		}
		if (DUCKDB_UNLIKELY((double)input == 0.0 || (double)input == -0.0)) {
			throw OutOfRangeException("input value %lf is out of range for numeric function cotangent", input);
		}
		return OP::template Operation<INPUT_TYPE, RESULT_TYPE>(input);
	}